

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O3

void Curl_httpchunk_init(Curl_easy *data,Curl_chunker *ch,_Bool ignore_body)

{
  ch->hexindex = '\0';
  ch->state = CHUNK_HEX;
  ch->last_code = CHUNKE_OK;
  Curl_dyn_init(&ch->trailer,0x1000);
  ch->field_0x42 = ch->field_0x42 & 0xfe | ignore_body;
  return;
}

Assistant:

void Curl_httpchunk_init(struct Curl_easy *data, struct Curl_chunker *ch,
                         bool ignore_body)
{
  (void)data;
  ch->hexindex = 0;      /* start at 0 */
  ch->state = CHUNK_HEX; /* we get hex first! */
  ch->last_code = CHUNKE_OK;
  Curl_dyn_init(&ch->trailer, DYN_H1_TRAILER);
  ch->ignore_body = ignore_body;
}